

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segments_test.cpp
# Opt level: O2

void __thiscall MixSegmentTest_TestUserDict_Test::TestBody(MixSegmentTest_TestUserDict_Test *this)

{
  pointer this_00;
  pointer begin;
  uint uVar1;
  int iVar2;
  int iVar3;
  string *actual;
  time_t tVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *actual_00;
  char *pcVar5;
  ulong uVar6;
  size_t i;
  long lVar7;
  bool bVar8;
  AssertHelper AStack_1a8;
  AssertionResult gtest_ar;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  allocator<char> local_179;
  string local_178;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  string res;
  MixSegment segment;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&res,"../test/testdata/extra_dict/jieba.dict.small.utf8",
             (allocator<char> *)&words);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"../dict/hmm_model.utf8",(allocator<char> *)&AStack_1a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,"../test/testdata/userdict.utf8",&local_179);
  cppjieba::MixSegment::MixSegment(&segment,&res,(string *)&gtest_ar,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&res);
  words.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  words.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  words.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  res._M_dataplus._M_p = (pointer)&res.field_2;
  res._M_string_length = 0;
  res.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,anon_var_dwarf_8785b,(allocator<char> *)&local_178);
  cppjieba::MixSegment::Cut(&segment,(string *)&gtest_ar,&words);
  std::__cxx11::string::~string((string *)&gtest_ar);
  actual = std::operator<<(&res,&words);
  testing::internal::CmpHelperEQ<char[61],std::__cxx11::string>
            ((internal *)&gtest_ar,anon_var_dwarf_87951,"res << words",&anon_var_dwarf_8796a,actual)
  ;
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_178);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_1a8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/test/unittest/segments_test.cpp"
               ,0x5d,pcVar5);
    testing::internal::AssertHelper::operator=(&AStack_1a8,(Message *)&local_178);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_ar,anon_var_dwarf_87983,(allocator<char> *)&local_178);
    cppjieba::MixSegment::Cut(&segment,(string *)&gtest_ar,&words);
    std::__cxx11::string::~string((string *)&gtest_ar);
    std::operator<<(&res,&words);
    testing::internal::CmpHelperEQ<char[105],std::__cxx11::string>
              ((internal *)&gtest_ar,anon_var_dwarf_87ac4,"res",&anon_var_dwarf_87add,&res);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_178);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&AStack_1a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/test/unittest/segments_test.cpp"
                 ,0x61,pcVar5);
      testing::internal::AssertHelper::operator=(&AStack_1a8,(Message *)&local_178);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&gtest_ar,"IBM,3.14",(allocator<char> *)&local_178);
      cppjieba::MixSegment::Cut(&segment,(string *)&gtest_ar,&words);
      std::__cxx11::string::~string((string *)&gtest_ar);
      std::operator<<(&res,&words);
      actual_00 = &res;
      testing::internal::CmpHelperEQ<char[29],std::__cxx11::string>
                ((internal *)&gtest_ar,
                 "\"[\\\"I\\\", \\\"B\\\", \\\"M\\\", \\\",\\\", \\\"3.14\\\"]\"","res",
                 (char (*) [29])"[\"I\", \"B\", \"M\", \",\", \"3.14\"]",actual_00);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_178);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&AStack_1a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/test/unittest/segments_test.cpp"
                   ,0x65,pcVar5);
        testing::internal::AssertHelper::operator=(&AStack_1a8,(Message *)&local_178);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&gtest_ar,anon_var_dwarf_87b1a,(allocator<char> *)&local_178);
        cppjieba::MixSegment::Cut(&segment,(string *)&gtest_ar,&words);
        std::__cxx11::string::~string((string *)&gtest_ar);
        begin = words.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
        this_00 = words.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_178,"/",(allocator<char> *)&AStack_1a8);
        limonp::
        Join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((string *)&gtest_ar,(limonp *)this_00,
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )begin,&local_178,actual_00);
        std::__cxx11::string::operator=((string *)&res,(string *)&gtest_ar);
        std::__cxx11::string::~string((string *)&gtest_ar);
        std::__cxx11::string::~string((string *)&local_178);
        testing::internal::CmpHelperEQ<char[51],std::__cxx11::string>
                  ((internal *)&gtest_ar,anon_var_dwarf_87b33,"res",&anon_var_dwarf_87b3e,&res);
        if (gtest_ar.success_ != false) {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          gtest_ar._0_8_ = &local_190;
          gtest_ar.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          local_190._M_local_buf[0] = '\0';
          tVar4 = time((time_t *)0x0);
          srand((uint)tVar4);
          for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
            uVar1 = rand();
            std::__cxx11::string::resize((ulong)&gtest_ar);
            uVar6 = (ulong)(uVar1 & 0xff);
            while (bVar8 = uVar6 != 0, uVar6 = uVar6 - 1, bVar8) {
              iVar2 = rand();
              iVar3 = rand();
              *(char *)(gtest_ar._0_8_ + (ulong)(long)iVar3 % (ulong)(uVar1 & 0xff)) = (char)iVar2;
            }
            cppjieba::MixSegment::Cut(&segment,(string *)&gtest_ar,&words);
          }
          std::__cxx11::string::~string((string *)&gtest_ar);
          goto LAB_0015539b;
        }
        testing::Message::Message((Message *)&local_178);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&AStack_1a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/test/unittest/segments_test.cpp"
                   ,0x69,pcVar5);
        testing::internal::AssertHelper::operator=(&AStack_1a8,(Message *)&local_178);
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&AStack_1a8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_178);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
LAB_0015539b:
  std::__cxx11::string::~string((string *)&res);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&words);
  cppjieba::MixSegment::~MixSegment(&segment);
  return;
}

Assistant:

TEST(MixSegmentTest, TestUserDict) {
  MixSegment segment("../test/testdata/extra_dict/jieba.dict.small.utf8", "../dict/hmm_model.utf8", 
        "../test/testdata/userdict.utf8");
  vector<string> words;
  string res;

  segment.Cut("令狐冲是云计算方面的专家", words);
  ASSERT_EQ("[\"令狐冲\", \"是\", \"云计算\", \"方面\", \"的\", \"专家\"]", res << words);

  segment.Cut("小明先就职于IBM,后在日本京都大学深造", words);
  res << words;
  ASSERT_EQ("[\"小明\", \"先\", \"就职\", \"于\", \"I\", \"B\", \"M\", \",\", \"后\", \"在\", \"日本\", \"京都大学\", \"深造\"]", res);

  segment.Cut("IBM,3.14", words);
  res << words;
  ASSERT_EQ("[\"I\", \"B\", \"M\", \",\", \"3.14\"]", res);

  segment.Cut("忽如一夜春风来，千树万树梨花开", words);
  res = limonp::Join(words.begin(), words.end(), "/");
  ASSERT_EQ("忽如一夜春风来/，/千树/万树/梨花/开", res);

  // rand input
  {
    const size_t ITERATION = 16;
    const size_t MAX_LEN = 256;
    string s;
    srand(time(NULL));

    for (size_t i = 0; i < ITERATION; i++) {
      size_t len = rand() % MAX_LEN;
      s.resize(len);
      for (size_t j = 0; j < len; j++) {
        s[rand() % len] = rand();
      }
      segment.Cut(s, words);
    }
  }
}